

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLongStressCase.cpp
# Opt level: O1

void __thiscall
deqp::gls::LongStressCaseInternal::Texture::setData
          (Texture *this,ConstPixelBufferAccess *src,int width,int height,deUint32 internalFormat,
          bool useMipmap)

{
  int iVar1;
  int iVar2;
  TransferFormat TVar3;
  uint uVar4;
  GLenum *pGVar5;
  GLenum target;
  undefined7 in_register_00000089;
  int iVar6;
  int face;
  uint uVar7;
  int iVar8;
  
  TVar3 = glu::getTransferFormat(src->m_format);
  iVar1 = 1;
  if ((int)CONCAT71(in_register_00000089,useMipmap) != 0) {
    uVar7 = height;
    if (height < width) {
      uVar7 = width;
    }
    uVar4 = 0x20;
    if (uVar7 != 0) {
      uVar4 = 0x1f;
      if (uVar7 != 0) {
        for (; uVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      uVar4 = uVar4 ^ 0x1f;
    }
    iVar1 = 0x20 - uVar4;
  }
  this->m_numMipLevels = iVar1;
  this->m_internalFormat = internalFormat;
  iVar1 = tcu::TextureFormat::getPixelSize(&src->m_format);
  this->m_dataSizeApprox =
       ((uint)(this->m_type == TEXTURETYPE_CUBE) * 5 + 1) * iVar1 * height * width;
  uVar4 = tcu::TextureFormat::getPixelSize(&src->m_format);
  uVar7 = 8;
  if ((int)uVar4 < 8) {
    uVar7 = uVar4;
  }
  if ((uVar4 & uVar4 - 1) != 0) {
    uVar7 = 1;
  }
  glwPixelStorei(0xcf5,uVar7);
  if (this->m_type == TEXTURETYPE_CUBE) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0x8513,this->m_textureGL);
    if (0 < this->m_numMipLevels) {
      iVar1 = 0;
      do {
        iVar8 = width >> ((byte)iVar1 & 0x1f);
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar6 = height >> ((byte)iVar1 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        iVar2 = tcu::TextureFormat::getPixelSize(&src->m_format);
        this->m_dataSizeApprox = this->m_dataSizeApprox + iVar2 * iVar8 * iVar6 * 6;
        pGVar5 = &DAT_01cf35bc;
        uVar7 = 0;
        do {
          target = 0;
          if (uVar7 < 6) {
            target = *pGVar5;
          }
          glwTexImage2D(target,iVar1,internalFormat,iVar8,iVar6,0,TVar3.format,TVar3.dataType,
                        src->m_data);
          uVar7 = uVar7 + 1;
          pGVar5 = pGVar5 + 1;
        } while (uVar7 != 6);
        iVar1 = iVar1 + 1;
      } while (iVar1 < this->m_numMipLevels);
    }
  }
  else if (this->m_type == TEXTURETYPE_2D) {
    this->m_dataSizeApprox = 0;
    glwBindTexture(0xde1,this->m_textureGL);
    if (0 < this->m_numMipLevels) {
      iVar1 = 0;
      do {
        iVar8 = width >> ((byte)iVar1 & 0x1f);
        if (iVar8 < 2) {
          iVar8 = 1;
        }
        iVar6 = height >> ((byte)iVar1 & 0x1f);
        if (iVar6 < 2) {
          iVar6 = 1;
        }
        iVar2 = tcu::TextureFormat::getPixelSize(&src->m_format);
        this->m_dataSizeApprox = this->m_dataSizeApprox + iVar2 * iVar8 * iVar6;
        glwTexImage2D(0xde1,iVar1,internalFormat,iVar8,iVar6,0,TVar3.format,TVar3.dataType,
                      src->m_data);
        iVar1 = iVar1 + 1;
      } while (iVar1 < this->m_numMipLevels);
    }
  }
  return;
}

Assistant:

void Texture::setData (const ConstPixelBufferAccess& src, const int width, const int height, const deUint32 internalFormat, const bool useMipmap)
{
	DE_ASSERT(m_type != TEXTURETYPE_CUBE || width == height);
	DE_ASSERT(!useMipmap || (deIsPowerOfTwo32(width) && deIsPowerOfTwo32(height)));

	const TextureFormat&		format		= src.getFormat();
	const glu::TransferFormat	transfer	= glu::getTransferFormat(format);

	m_numMipLevels = useMipmap ? deLog2Floor32(de::max(width, height))+1 : 1;

	m_internalFormat = internalFormat;
	m_dataSizeApprox = width * height * format.getPixelSize() * (m_type == TEXTURETYPE_CUBE ? 6 : 1);

	DE_ASSERT(src.getRowPitch() == format.getPixelSize()*src.getWidth());
	DE_ASSERT(isMatchingGLInternalFormat(internalFormat, format));
	DE_ASSERT(width <= src.getWidth() && height <= src.getHeight());

	glPixelStorei(GL_UNPACK_ALIGNMENT, computePixelStore(format));

	if (m_type == TEXTURETYPE_2D)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_2D, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += levelWid * levelHei * format.getPixelSize();
			glTexImage2D(GL_TEXTURE_2D, level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else if (m_type == TEXTURETYPE_CUBE)
	{
		m_dataSizeApprox = 0;

		glBindTexture(GL_TEXTURE_CUBE_MAP, m_textureGL);
		for (int level = 0; level < m_numMipLevels; level++)
		{
			const int levelWid = de::max(1, width>>level);
			const int levelHei = de::max(1, height>>level);
			m_dataSizeApprox += 6 * levelWid * levelHei * format.getPixelSize();
			for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
				glTexImage2D(cubeFaceToGLFace((CubeFace)face), level, internalFormat, levelWid, levelHei, 0, transfer.format, transfer.dataType, src.getDataPtr());
		}
	}
	else
		DE_ASSERT(false);
}